

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O1

ostream * Indexing::operator<<
                    (ostream *out,
                    Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_> *self)

{
  Node *pNVar1;
  Symbol *self_00;
  bool bVar2;
  Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_> *pMVar3;
  char cVar4;
  ostream *poVar5;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar6;
  char *pcVar7;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar8;
  uint uVar9;
  Multiline<Indexing::SubstitutionTree<Indexing::LiteralClause>_> local_50;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *local_40;
  Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  puVar8 = (self->self->_trees)._stack;
  puVar6 = (self->self->_trees)._cursor;
  local_38 = self;
  if (puVar8 != puVar6) {
    uVar9 = 0;
    bVar2 = false;
    local_40 = puVar6;
    do {
      pNVar1 = ((puVar8->_M_t).
                super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
               ._M_head_impl)->_root;
      if (pNVar1 != (Node *)0x0) {
        cVar4 = (**(code **)((long)pNVar1->_vptr_Node + 0x18))();
        pMVar3 = local_38;
        if (cVar4 == '\0') {
          self_00 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x80) + (ulong)(uVar9 >> 1) * 8);
          local_50.indent = local_38->indent;
          local_50.self = (SubstitutionTree<Indexing::LiteralClause> *)0x91988f;
          ::Lib::Output::operator<<(out,(Repeat<char[5]> *)&local_50);
          pcVar7 = "~";
          if (!bVar2) {
            pcVar7 = " ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,1);
          poVar5 = Kernel::operator<<(out,self_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
          puVar6 = local_40;
          local_50.self =
               (puVar8->_M_t).
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl;
          local_50.indent = pMVar3->indent + 1;
          poVar5 = operator<<(poVar5,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
      }
      uVar9 = uVar9 + 1;
      bVar2 = (bool)(bVar2 ^ 1);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"} ",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Output::Multiline<LiteralSubstitutionTree<LeafData_>> const& self)
  { 
    int i = 0;
    out << "{ " << std::endl;
    for (auto& t : self.self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        Output::Multiline<LiteralSubstitutionTree>::outputIndent(out, self.indent);
        out << (idxIsNegative(i) ? "~" : " ") << *f << "(" << Output::multiline(*t, self.indent + 1) << ")" << std::endl; 
      }
      i++;
    }
    return out << "} ";
  }